

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::pod_vector<Clasp::ConstString,_std::allocator<Clasp::ConstString>_>::push_back
          (pod_vector<Clasp::ConstString,_std::allocator<Clasp::ConstString>_> *this,ConstString *x)

{
  size_type sVar1;
  size_type sVar2;
  pod_vector<Clasp::ConstString,_std::allocator<Clasp::ConstString>_> *in_RDI;
  ConstString *in_stack_00000010;
  ConstString *in_stack_ffffffffffffffd8;
  
  sVar1 = size(in_RDI);
  sVar2 = capacity(in_RDI);
  if (sVar1 < sVar2) {
    (in_RDI->ebo_).size = (in_RDI->ebo_).size + 1;
    Clasp::ConstString::ConstString((ConstString *)in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    append_realloc(this,x._4_4_,in_stack_00000010);
  }
  return;
}

Assistant:

void push_back(const T& x) {
		if (size() < capacity()) {
			new ((ebo_.buf+ebo_.size++)) T(x);
		}
		else {
			append_realloc(1, x);
		}
	}